

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_reset(drmp3 *pMP3)

{
  drmp3dec *in_RDI;
  
  in_RDI[1].mdct_overlap[0][0xf] = 0.0;
  in_RDI[1].mdct_overlap[0][0x10] = 0.0;
  in_RDI[2].qmf_state[0x4e] = 0.0;
  in_RDI[2].qmf_state[0x4f] = 0.0;
  *(float *)((long)(in_RDI[3].mdct_overlap + 1) + 0x14) = 0.0;
  *(float *)((long)(in_RDI[3].mdct_overlap + 1) + 0x18) = 0.0;
  *(byte *)(in_RDI[3].mdct_overlap[1] + 0xb) = *(byte *)(in_RDI[3].mdct_overlap[1] + 0xb) & 0xfe;
  in_RDI[2].qmf_state[0x5c] = 0.0;
  in_RDI[2].qmf_state[0x5d] = 0.0;
  in_RDI[2].qmf_state[0x5e] = 0.0;
  in_RDI[2].qmf_state[0x5f] = 0.0;
  in_RDI[3].mdct_overlap[0][0x11b] = 0.0;
  in_RDI[3].mdct_overlap[0][0x11c] = 0.0;
  *(float *)((long)(in_RDI[3].mdct_overlap + 0) + 0x474) = 0.0;
  *(float *)((long)(in_RDI[3].mdct_overlap + 0) + 0x478) = 0.0;
  *(byte *)(in_RDI[3].mdct_overlap[0] + 0x11f) = *(byte *)(in_RDI[3].mdct_overlap[0] + 0x11f) & 0xfd
  ;
  *(byte *)(in_RDI[3].mdct_overlap[0] + 0x11f) = *(byte *)(in_RDI[3].mdct_overlap[0] + 0x11f) & 0xfe
  ;
  drmp3dec_init(in_RDI);
  return;
}

Assistant:

void drmp3_reset(drmp3* pMP3)
{
            drmp3_assert(pMP3 != NULL);

    pMP3->pcmFramesConsumedInMP3Frame = 0;
    pMP3->pcmFramesRemainingInMP3Frame = 0;
    pMP3->currentPCMFrame = 0;
    pMP3->dataSize = 0;
    pMP3->atEnd = DRMP3_FALSE;
    pMP3->src.bin[0] = 0;
    pMP3->src.bin[1] = 0;
    pMP3->src.bin[2] = 0;
    pMP3->src.bin[3] = 0;
    pMP3->src.cache.cachedFrameCount = 0;
    pMP3->src.cache.iNextFrame = 0;
    pMP3->src.algo.linear.alpha = 0;
    pMP3->src.algo.linear.isNextFramesLoaded = 0;
    pMP3->src.algo.linear.isPrevFramesLoaded = 0;
    //drmp3_zero_object(&pMP3->decoder);
    drmp3dec_init(&pMP3->decoder);
}